

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.c
# Opt level: O0

void av1_save_context(MACROBLOCK *x,RD_SEARCH_MACROBLOCK_CONTEXT *ctx,int mi_row,int mi_col,
                     BLOCK_SIZE bsize,int num_planes)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  int in_ECX;
  uint in_EDX;
  long in_RSI;
  long in_RDI;
  byte in_R8B;
  int in_R9D;
  int tx_row;
  int tx_col;
  int mi_height;
  int mi_width;
  int p;
  MACROBLOCKD *xd;
  int local_2c;
  
  lVar3 = in_RDI + 0x1a0;
  uVar1 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[in_R8B]
  ;
  uVar2 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[in_R8B]
  ;
  for (local_2c = 0; local_2c < in_R9D; local_2c = local_2c + 1) {
    memcpy((void *)(in_RSI + (int)(uVar1 * local_2c)),
           (void *)(*(long *)(in_RDI + 0x20c0 + (long)local_2c * 8) +
                   (long)(in_ECX >>
                         ((byte)*(undefined4 *)(lVar3 + (long)local_2c * 0xa30 + 0x14) & 0x1f))),
           (ulong)(long)(int)uVar1 >>
           ((byte)*(undefined4 *)(lVar3 + (long)local_2c * 0xa30 + 0x14) & 0x3f));
    memcpy((void *)(in_RSI + 0x60 + (long)(int)(uVar2 * local_2c)),
           (void *)(in_RDI + 0x20d8 + (long)local_2c * 0x20 +
                   (long)((int)(in_EDX & 0x1f) >>
                         ((byte)*(undefined4 *)(lVar3 + (long)local_2c * 0xa30 + 0x18) & 0x1f))),
           (ulong)(long)(int)uVar2 >>
           ((byte)*(undefined4 *)(lVar3 + (long)local_2c * 0xa30 + 0x18) & 0x3f));
  }
  memcpy((void *)(in_RSI + 0xc0),(void *)(*(long *)(in_RDI + 0x2138) + (long)in_ECX),
         (long)(int)uVar1);
  memcpy((void *)(in_RSI + 0xe0),(void *)(in_RDI + 0x2140 + (long)(int)(in_EDX & 0x1f)),
         (long)(int)uVar2);
  memcpy((void *)(in_RSI + 0x110),*(void **)(in_RDI + 0x2160),(long)(int)uVar1);
  memcpy((void *)(in_RSI + 0x130),*(void **)(in_RDI + 0x2168),(long)(int)uVar2);
  *(undefined8 *)(in_RSI + 0x100) = *(undefined8 *)(in_RDI + 0x2160);
  *(undefined8 *)(in_RSI + 0x108) = *(undefined8 *)(in_RDI + 0x2168);
  return;
}

Assistant:

void av1_save_context(const MACROBLOCK *x, RD_SEARCH_MACROBLOCK_CONTEXT *ctx,
                      int mi_row, int mi_col, BLOCK_SIZE bsize,
                      const int num_planes) {
  const MACROBLOCKD *xd = &x->e_mbd;
  int p;
  int mi_width = mi_size_wide[bsize];
  int mi_height = mi_size_high[bsize];

  // buffer the above/left context information of the block in search.
  for (p = 0; p < num_planes; ++p) {
    int tx_col = mi_col;
    int tx_row = mi_row & MAX_MIB_MASK;
    memcpy(
        ctx->a + mi_width * p,
        xd->above_entropy_context[p] + (tx_col >> xd->plane[p].subsampling_x),
        (sizeof(ENTROPY_CONTEXT) * mi_width) >> xd->plane[p].subsampling_x);
    memcpy(ctx->l + mi_height * p,
           xd->left_entropy_context[p] + (tx_row >> xd->plane[p].subsampling_y),
           (sizeof(ENTROPY_CONTEXT) * mi_height) >> xd->plane[p].subsampling_y);
  }
  memcpy(ctx->sa, xd->above_partition_context + mi_col,
         sizeof(*xd->above_partition_context) * mi_width);
  memcpy(ctx->sl, xd->left_partition_context + (mi_row & MAX_MIB_MASK),
         sizeof(xd->left_partition_context[0]) * mi_height);
  memcpy(ctx->ta, xd->above_txfm_context,
         sizeof(*xd->above_txfm_context) * mi_width);
  memcpy(ctx->tl, xd->left_txfm_context,
         sizeof(*xd->left_txfm_context) * mi_height);
  ctx->p_ta = xd->above_txfm_context;
  ctx->p_tl = xd->left_txfm_context;
}